

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Single_Window.H
# Opt level: O2

void __thiscall Fl_Single_Window::~Fl_Single_Window(Fl_Single_Window *this)

{
  Fl_Window::~Fl_Window(&this->super_Fl_Window);
  operator_delete(this,0xf0);
  return;
}

Assistant:

class FL_EXPORT Fl_Single_Window : public Fl_Window {
public:
  void show();
  void show(int a, char **b) {Fl_Window::show(a,b);}
  void flush();
   /**
    Creates a new Fl_Single_Window widget using the given
    size, and label (title) string.
  */
  Fl_Single_Window(int W, int H, const char *l=0);

  /**
    Creates a new Fl_Single_Window widget using the given
    position, size, and label (title) string.
  */
  Fl_Single_Window(int X, int Y, int W, int H, const char *l=0);
  
  int make_current();
}